

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_tar.c
# Opt level: O2

wchar_t pax_attribute_read_time
                  (archive_read *a,size_t value_length,int64_t *ps,long *pn,int64_t *unconsumed)

{
  wchar_t wVar1;
  long *plVar2;
  ulong uVar3;
  byte bVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  bool bVar8;
  archive_string local_48;
  
  if (0x80 < value_length) {
    __archive_read_consume(a,value_length);
    *ps = 0;
    *pn = 0;
    return L'\xffffffe2';
  }
  local_48.s = (char *)0x0;
  local_48.length = 0;
  local_48.buffer_length = 0;
  wVar1 = read_bytes_to_string(a,&local_48,value_length,unconsumed);
  if (wVar1 < L'\0') {
    archive_string_free(&local_48);
    return wVar1;
  }
  plVar2 = ps;
  if (local_48.length != 0) {
    uVar3 = (ulong)(*local_48.s == '-');
    uVar6 = -uVar3 | 1;
    lVar7 = 0;
    for (lVar5 = 0; (uVar3 - local_48.length) + lVar5 != 0; lVar5 = lVar5 + 1) {
      bVar4 = local_48.s[lVar5 + uVar3] - 0x30;
      if (9 < bVar4) {
LAB_00130bad:
        *ps = lVar7 * uVar6;
        *pn = 0;
        if (local_48.s[lVar5 + uVar3] != '.') goto LAB_00130c1d;
        lVar7 = 0;
        uVar6 = 100000000;
        goto LAB_00130bdd;
      }
      if ((0xccccccccccccccc < lVar7) || (lVar7 == 0xccccccccccccccc && 7 < bVar4)) {
        lVar7 = 0x7fffffffffffffff;
        goto LAB_00130bad;
      }
      lVar7 = (ulong)bVar4 + lVar7 * 10;
    }
    *ps = lVar7 * uVar6;
    plVar2 = pn;
  }
  *plVar2 = 0;
  goto LAB_00130c1d;
  while( true ) {
    lVar7 = lVar7 + (byte)(local_48.s[lVar5 + uVar3 + 1] - 0x30U) * uVar6;
    *pn = lVar7;
    lVar5 = lVar5 + 1;
    bVar8 = uVar6 < 10;
    uVar6 = uVar6 / 10;
    if (bVar8) break;
LAB_00130bdd:
    if ((-uVar3 + local_48.length + -1 == lVar5) ||
       (9 < (byte)(local_48.s[lVar5 + uVar3 + 1] - 0x30U))) break;
  }
LAB_00130c1d:
  archive_string_free(&local_48);
  wVar1 = L'\xffffffec';
  if ((ulong)*ps < 0x7fffffffffffffff) {
    wVar1 = L'\0';
  }
  return wVar1;
}

Assistant:

static int
pax_attribute_read_time(struct archive_read *a, size_t value_length, int64_t *ps, long *pn, int64_t *unconsumed) {
	struct archive_string as;
	int r;

	if (value_length > 128) {
		__archive_read_consume(a, value_length);
		*ps = 0;
		*pn = 0;
		return (ARCHIVE_FATAL);
	}

	archive_string_init(&as);
	r = read_bytes_to_string(a, &as, value_length, unconsumed);
	if (r < ARCHIVE_OK) {
		archive_string_free(&as);
		return (r);
	}

	pax_time(as.s, archive_strlen(&as), ps, pn);
	archive_string_free(&as);
	if (*ps < 0 || *ps == INT64_MAX) {
		return (ARCHIVE_WARN);
	}
	return (ARCHIVE_OK);
}